

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_end(nk_font_atlas *atlas,nk_handle texture,nk_draw_null_texture *null)

{
  nk_vec2 nVar1;
  nk_font *local_30;
  nk_font *font_iter;
  int i;
  nk_draw_null_texture *null_local;
  nk_font_atlas *atlas_local;
  nk_handle texture_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3611,
                  "void nk_font_atlas_end(struct nk_font_atlas *, nk_handle, struct nk_draw_null_texture *)"
                 );
  }
  if (atlas == (nk_font_atlas *)0x0) {
    if (null == (nk_draw_null_texture *)0x0) {
      return;
    }
    null->texture = texture;
    nVar1 = nk_vec2(0.5,0.5);
    null->uv = nVar1;
  }
  if (null != (nk_draw_null_texture *)0x0) {
    null->texture = texture;
    (null->uv).x = ((float)(int)(atlas->custom).x + 0.5) / (float)atlas->tex_width;
    (null->uv).y = ((float)(int)(atlas->custom).y + 0.5) / (float)atlas->tex_height;
  }
  for (local_30 = atlas->fonts; local_30 != (nk_font *)0x0; local_30 = local_30->next) {
    local_30->texture = texture;
    (local_30->handle).texture = texture;
  }
  for (font_iter._4_4_ = 0; font_iter._4_4_ < 7; font_iter._4_4_ = font_iter._4_4_ + 1) {
    *(nk_handle *)(atlas->cursors + font_iter._4_4_) = texture;
  }
  (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
  atlas->pixel = (void *)0x0;
  atlas->tex_width = 0;
  atlas->tex_height = 0;
  (atlas->custom).x = 0;
  (atlas->custom).y = 0;
  (atlas->custom).w = 0;
  (atlas->custom).h = 0;
  return;
}

Assistant:

NK_API void
nk_font_atlas_end(struct nk_font_atlas *atlas, nk_handle texture,
    struct nk_draw_null_texture *null)
{
    int i = 0;
    struct nk_font *font_iter;
    NK_ASSERT(atlas);
    if (!atlas) {
        if (!null) return;
        null->texture = texture;
        null->uv = nk_vec2(0.5f,0.5f);
    }
    if (null) {
        null->texture = texture;
        null->uv.x = (atlas->custom.x + 0.5f)/(float)atlas->tex_width;
        null->uv.y = (atlas->custom.y + 0.5f)/(float)atlas->tex_height;
    }
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        font_iter->texture = texture;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
        font_iter->handle.texture = texture;
#endif
    }
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        atlas->cursors[i].img.handle = texture;

    atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
    atlas->pixel = 0;
    atlas->tex_width = 0;
    atlas->tex_height = 0;
    atlas->custom.x = 0;
    atlas->custom.y = 0;
    atlas->custom.w = 0;
    atlas->custom.h = 0;
}